

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O2

void __thiscall
QAccessibleTextWidget::setSelection
          (QAccessibleTextWidget *this,int selectionIndex,int startOffset,int endOffset)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  QTextCursor cursor;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (selectionIndex == 0) {
    _cursor = &DAT_aaaaaaaaaaaaaaaa;
    (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x158))(&cursor,this);
    iVar2 = (int)&cursor;
    QTextCursor::setPosition(iVar2,startOffset);
    QTextCursor::setPosition(iVar2,endOffset);
    (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x160))(this,&cursor);
    QTextCursor::~QTextCursor(&cursor);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAccessibleTextWidget::setSelection(int selectionIndex, int startOffset, int endOffset)
{
    if (selectionIndex != 0)
        return;

    QTextCursor cursor = textCursor();
    cursor.setPosition(startOffset, QTextCursor::MoveAnchor);
    cursor.setPosition(endOffset, QTextCursor::KeepAnchor);
    setTextCursor(cursor);
}